

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O2

void absl::lts_20250127::SetLogBacktraceLocation(string_view file,int line)

{
  string_view file_00;
  size_t in_RAX;
  char *unaff_retaddr;
  
  file_00._M_str = unaff_retaddr;
  file_00._M_len = in_RAX;
  _ZN4absl12lts_2025012712_GLOBAL__N_121log_backtrace_at_hashE_0 =
       anon_unknown_1::HashSiteForLogBacktraceAt(file_00,0);
  return;
}

Assistant:

void SetLogBacktraceLocation(absl::string_view file, int line) {
  log_backtrace_at_hash.store(HashSiteForLogBacktraceAt(file, line),
                              std::memory_order_relaxed);
}